

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_ping.c
# Opt level: O3

ssize_t tnt_ping(tnt_stream *s)

{
  uint uVar1;
  ulong uVar2;
  ssize_t sVar3;
  undefined1 uVar4;
  long lVar5;
  char *pcVar6;
  undefined1 local_78 [8];
  iovec v [3];
  tnt_iheader hdr;
  undefined1 local_13;
  undefined1 auStack_12 [7];
  char len_prefix [9];
  char body [2];
  
  uVar2 = s->reqid;
  s->reqid = uVar2 + 1;
  v[2].iov_len._1_1_ = 0;
  v[2].iov_len._5_1_ = 0;
  v[2].iov_len._6_1_ = 0;
  v[2].iov_len._7_1_ = 0;
  v[2].iov_len._0_1_ = 0x82;
  v[2].iov_len._2_2_ = 0x140;
  uVar4 = (undefined1)uVar2;
  if (uVar2 < 0x80) {
    lVar5 = 1;
    v[2].iov_len._4_1_ = uVar4;
  }
  else if (uVar2 < 0x100) {
    v[2].iov_len._4_1_ = 0xcc;
    lVar5 = 2;
    v[2].iov_len._5_1_ = uVar4;
  }
  else {
    v[2].iov_len._5_1_ = (undefined1)(uVar2 >> 8);
    if (uVar2 < 0x10000) {
      v[2].iov_len._4_1_ = 0xcd;
      lVar5 = 3;
      v[2].iov_len._6_1_ = uVar4;
    }
    else if (uVar2 >> 0x20 == 0) {
      v[2].iov_len._4_1_ = 0xce;
      v[2].iov_len._6_1_ = (undefined1)(uVar2 >> 0x10);
      v[2].iov_len._7_1_ = v[2].iov_len._5_1_;
      v[2].iov_len._5_1_ = (undefined1)(uVar2 >> 0x18);
      lVar5 = 5;
    }
    else {
      v[2].iov_len._4_1_ = 0xcf;
      v[2].iov_len._6_1_ = (undefined1)(uVar2 >> 0x30);
      v[2].iov_len._7_1_ = (undefined1)(uVar2 >> 0x28);
      v[2].iov_len._5_1_ = (undefined1)(uVar2 >> 0x38);
      lVar5 = 9;
    }
  }
  v[0].iov_len = (size_t)&v[2].iov_len;
  v[1].iov_base = (void *)((long)v + (lVar5 - v[0].iov_len) + 0x2c);
  v[1].iov_len = (size_t)(len_prefix + 1);
  len_prefix[1] = -0x80;
  v[2].iov_base = (void *)0x1;
  uVar2 = (long)v[1].iov_base + 1;
  if (uVar2 >> 0x20 == 0) {
    pcVar6 = auStack_12 + 4;
    uVar1 = (uint)uVar2;
    _auStack_12 = CONCAT44(stack0xfffffffffffffff2,
                           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                           uVar1 << 0x18);
    local_13 = 0xce;
  }
  else {
    pcVar6 = len_prefix + 1;
    _auStack_12 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                  (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                  (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28
                  | uVar2 << 0x38;
    local_13 = 0xcf;
  }
  local_78 = (undefined1  [8])&local_13;
  v[0].iov_base = pcVar6 + -(long)local_78;
  sVar3 = (*s->writev)(s,(iovec *)local_78,3);
  return sVar3;
}

Assistant:

ssize_t
tnt_ping(struct tnt_stream *s)
{
	struct tnt_iheader hdr;
	struct iovec v[3]; int v_sz = 3;
	char *data = NULL;
	encode_header(&hdr, TNT_OP_PING, s->reqid++);
	v[1].iov_base = (void *)hdr.header;
	v[1].iov_len  = hdr.end - hdr.header;
	char body[2]; data = body;

	data = mp_encode_map(data, 0);
	v[2].iov_base = body;
	v[2].iov_len  = data - body;

	size_t package_len = 0;
	for (int i = 1; i < v_sz; ++i)
		package_len += v[i].iov_len;
	char len_prefix[9];
	char *len_end = mp_encode_luint32(len_prefix, package_len);
	v[0].iov_base = len_prefix;
	v[0].iov_len = len_end - len_prefix;
	return s->writev(s, v, v_sz);
}